

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

void av1_build_quantizer(aom_bit_depth_t bit_depth,int y_dc_delta_q,int u_dc_delta_q,
                        int u_ac_delta_q,int v_dc_delta_q,int v_ac_delta_q,QUANTS *quants,
                        Dequants *deq,int sharpness)

{
  int iVar1;
  int16_t iVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int qindex;
  uint uVar7;
  long lVar8;
  int16_t *piVar9;
  int iVar10;
  int iVar11;
  int16_t *piVar12;
  int16_t (*paiVar13) [8];
  bool bVar14;
  int16_t (*local_148) [8];
  
  iVar4 = sharpness * -0x10 + 0x70;
  iVar4 = (int)((ulong)((long)iVar4 * 0x6db6db6d) >> 0x20) - iVar4;
  iVar4 = ((iVar4 >> 2) - (iVar4 >> 0x1f)) + 0x40;
  piVar9 = quants->v_round[0] + 2;
  piVar12 = deq->v_dequant_QTX[0] + 2;
  lVar8 = 0;
  paiVar13 = quants->v_round;
  local_148 = deq->v_dequant_QTX;
  do {
    qindex = (int)lVar8;
    iVar2 = av1_dc_quant_QTX(qindex,0,bit_depth);
    if (bit_depth == AOM_BITS_12) {
      bVar14 = SBORROW4((int)iVar2,0x940);
      iVar10 = iVar2 + -0x940;
LAB_0019e885:
      bVar14 = bVar14 != iVar10 < 0;
LAB_0019e88d:
      iVar10 = (uint)bVar14 * 4 + 0x50;
      if (lVar8 == 0) {
        iVar10 = 0x40;
      }
    }
    else {
      if (bit_depth == AOM_BITS_10) {
        bVar14 = SBORROW4((int)iVar2,0x250);
        iVar10 = iVar2 + -0x250;
        goto LAB_0019e885;
      }
      iVar10 = -1;
      if (bit_depth == AOM_BITS_8) {
        bVar14 = iVar2 < 0x94;
        goto LAB_0019e88d;
      }
    }
    bVar14 = lVar8 != 0;
    iVar5 = (uint)(lVar8 == 0) * 0x10 + 0x30;
    iVar11 = 0x40;
    if (bVar14 && sharpness != 0) {
      iVar11 = iVar4;
    }
    lVar6 = 0;
    do {
      if (bVar14 && sharpness != 0) {
        iVar5 = iVar4;
      }
      if (lVar6 == 0) {
        sVar3 = av1_dc_quant_QTX(qindex,y_dc_delta_q,bit_depth);
      }
      else {
        sVar3 = av1_ac_quant_QTX(qindex,0,bit_depth);
      }
      uVar7 = (uint)sVar3;
      iVar1 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      ((QUANTS *)(paiVar13 + -0x1100))->y_quant[0][lVar6] =
           (short)((0x10000 << ((byte)iVar1 & 0x1f)) / (int)uVar7) + 1;
      paiVar13[-0x1000][lVar6] = (int16_t)(1 << (0x10 - (byte)iVar1 & 0x1f));
      paiVar13[-0xd00][lVar6] = (int16_t)(0x10000 / (long)(int)uVar7);
      paiVar13[-0xa00][lVar6] = (int16_t)(iVar11 * uVar7 >> 7);
      paiVar13[-0xf00][lVar6] = (int16_t)(iVar10 * uVar7 + 0x40 >> 7);
      paiVar13[-0xe00][lVar6] = (int16_t)(iVar5 * uVar7 >> 7);
      ((Dequants *)(local_148 + -0x200))->y_dequant_QTX[0][lVar6] = sVar3;
      if (lVar6 == 0) {
        sVar3 = av1_dc_quant_QTX(qindex,u_dc_delta_q,bit_depth);
      }
      else {
        sVar3 = av1_ac_quant_QTX(qindex,u_ac_delta_q,bit_depth);
      }
      uVar7 = (uint)sVar3;
      iVar1 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      paiVar13[-0x700][lVar6] = (short)((0x10000 << ((byte)iVar1 & 0x1f)) / (int)uVar7) + 1;
      paiVar13[-0x500][lVar6] = (int16_t)(1 << (0x10 - (byte)iVar1 & 0x1f));
      paiVar13[-0xc00][lVar6] = (int16_t)(0x10000 / (long)(int)uVar7);
      paiVar13[-0x900][lVar6] = (int16_t)(iVar11 * uVar7 >> 7);
      paiVar13[-0x300][lVar6] = (int16_t)(iVar10 * uVar7 + 0x40 >> 7);
      paiVar13[-0x100][lVar6] = (int16_t)(iVar5 * uVar7 >> 7);
      local_148[-0x100][lVar6] = sVar3;
      if (lVar6 == 0) {
        sVar3 = av1_dc_quant_QTX(qindex,v_dc_delta_q,bit_depth);
      }
      else {
        sVar3 = av1_ac_quant_QTX(qindex,v_ac_delta_q,bit_depth);
      }
      uVar7 = (uint)sVar3;
      iVar1 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      paiVar13[-0x600][lVar6] = (short)((0x10000 << ((byte)iVar1 & 0x1f)) / (int)uVar7) + 1;
      paiVar13[-0x400][lVar6] = (int16_t)(1 << (0x10 - (byte)iVar1 & 0x1f));
      paiVar13[-0xb00][lVar6] = (int16_t)(0x10000 / (long)(int)uVar7);
      paiVar13[-0x800][lVar6] = (int16_t)(iVar11 * uVar7 >> 7);
      paiVar13[-0x200][lVar6] = (int16_t)(iVar10 * uVar7 + 0x40 >> 7);
      (*paiVar13)[lVar6] = (int16_t)(iVar5 * uVar7 >> 7);
      (*local_148)[lVar6] = sVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    lVar6 = 0;
    do {
      piVar9[lVar6 + -0x8800] = quants->y_quant[lVar8][1];
      piVar9[lVar6 + -0x6800] = quants->y_quant_fp[lVar8][1];
      piVar9[lVar6 + -0x5000] = quants->y_round_fp[lVar8][1];
      piVar9[lVar6 + -0x8000] = quants->y_quant_shift[lVar8][1];
      piVar9[lVar6 + -0x7800] = quants->y_zbin[lVar8][1];
      piVar9[lVar6 + -0x7000] = quants->y_round[lVar8][1];
      piVar12[lVar6 + -0x1000] = deq->y_dequant_QTX[lVar8][1];
      piVar9[lVar6 + -0x3800] = quants->u_quant[lVar8][1];
      piVar9[lVar6 + -0x6000] = quants->u_quant_fp[lVar8][1];
      piVar9[lVar6 + -0x4800] = quants->u_round_fp[lVar8][1];
      piVar9[lVar6 + -0x2800] = quants->u_quant_shift[lVar8][1];
      piVar9[lVar6 + -0x1800] = quants->u_zbin[lVar8][1];
      piVar9[lVar6 + -0x800] = quants->u_round[lVar8][1];
      piVar12[lVar6 + -0x800] = deq->u_dequant_QTX[lVar8][1];
      piVar9[lVar6 + -0x3000] = quants->v_quant[lVar8][1];
      piVar9[lVar6 + -0x5800] = quants->v_quant_fp[lVar8][1];
      piVar9[lVar6 + -0x4000] = quants->v_round_fp[lVar8][1];
      piVar9[lVar6 + -0x2000] = quants->v_quant_shift[lVar8][1];
      piVar9[lVar6 + -0x1000] = quants->v_zbin[lVar8][1];
      piVar9[lVar6] = quants->v_round[lVar8][1];
      piVar12[lVar6] = deq->v_dequant_QTX[lVar8][1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar8 = lVar8 + 1;
    paiVar13 = paiVar13 + 1;
    local_148 = local_148 + 1;
    piVar9 = piVar9 + 8;
    piVar12 = piVar12 + 8;
    if (lVar8 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

void av1_build_quantizer(aom_bit_depth_t bit_depth, int y_dc_delta_q,
                         int u_dc_delta_q, int u_ac_delta_q, int v_dc_delta_q,
                         int v_ac_delta_q, QUANTS *const quants,
                         Dequants *const deq, int sharpness) {
  int i, q, quant_QTX;
  const int sharpness_adjustment = 16 * (7 - sharpness) / 7;

  for (q = 0; q < QINDEX_RANGE; q++) {
    const int qzbin_factor = get_qzbin_factor(q, bit_depth);
    int qrounding_factor = q == 0 ? 64 : 48;

    for (i = 0; i < 2; ++i) {
      int qrounding_factor_fp = 64;

      if (sharpness != 0 && q != 0) {
        qrounding_factor = 64 - sharpness_adjustment;
        qrounding_factor_fp = 64 - sharpness_adjustment;
      }

      // y quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, y_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, 0, bit_depth);
      invert_quant(&quants->y_quant[q][i], &quants->y_quant_shift[q][i],
                   quant_QTX);
      quants->y_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->y_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->y_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->y_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->y_dequant_QTX[q][i] = quant_QTX;

      // u quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, u_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, u_ac_delta_q, bit_depth);
      invert_quant(&quants->u_quant[q][i], &quants->u_quant_shift[q][i],
                   quant_QTX);
      quants->u_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->u_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->u_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->u_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->u_dequant_QTX[q][i] = quant_QTX;

      // v quantizer with TX scale
      quant_QTX = i == 0 ? av1_dc_quant_QTX(q, v_dc_delta_q, bit_depth)
                         : av1_ac_quant_QTX(q, v_ac_delta_q, bit_depth);
      invert_quant(&quants->v_quant[q][i], &quants->v_quant_shift[q][i],
                   quant_QTX);
      quants->v_quant_fp[q][i] = (1 << 16) / quant_QTX;
      quants->v_round_fp[q][i] = (qrounding_factor_fp * quant_QTX) >> 7;
      quants->v_zbin[q][i] = ROUND_POWER_OF_TWO(qzbin_factor * quant_QTX, 7);
      quants->v_round[q][i] = (qrounding_factor * quant_QTX) >> 7;
      deq->v_dequant_QTX[q][i] = quant_QTX;
    }

    for (i = 2; i < 8; i++) {  // 8: SIMD width
      quants->y_quant[q][i] = quants->y_quant[q][1];
      quants->y_quant_fp[q][i] = quants->y_quant_fp[q][1];
      quants->y_round_fp[q][i] = quants->y_round_fp[q][1];
      quants->y_quant_shift[q][i] = quants->y_quant_shift[q][1];
      quants->y_zbin[q][i] = quants->y_zbin[q][1];
      quants->y_round[q][i] = quants->y_round[q][1];
      deq->y_dequant_QTX[q][i] = deq->y_dequant_QTX[q][1];

      quants->u_quant[q][i] = quants->u_quant[q][1];
      quants->u_quant_fp[q][i] = quants->u_quant_fp[q][1];
      quants->u_round_fp[q][i] = quants->u_round_fp[q][1];
      quants->u_quant_shift[q][i] = quants->u_quant_shift[q][1];
      quants->u_zbin[q][i] = quants->u_zbin[q][1];
      quants->u_round[q][i] = quants->u_round[q][1];
      deq->u_dequant_QTX[q][i] = deq->u_dequant_QTX[q][1];

      quants->v_quant[q][i] = quants->v_quant[q][1];
      quants->v_quant_fp[q][i] = quants->v_quant_fp[q][1];
      quants->v_round_fp[q][i] = quants->v_round_fp[q][1];
      quants->v_quant_shift[q][i] = quants->v_quant_shift[q][1];
      quants->v_zbin[q][i] = quants->v_zbin[q][1];
      quants->v_round[q][i] = quants->v_round[q][1];
      deq->v_dequant_QTX[q][i] = deq->v_dequant_QTX[q][1];
    }
  }
}